

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnGlobalGet(SharedValidator *this,Location *loc,Var *global_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Enum EVar4;
  bool bVar5;
  GlobalType global_type;
  GlobalType local_88;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0x1c,loc);
  local_88.type.enum_ = Any;
  local_88.type.type_index_ = 0xffffffff;
  local_88.mutable_ = true;
  Var::Var(&local_78,global_var);
  RVar2 = CheckGlobalIndex(this,&local_78,&local_88);
  Var::~Var(&local_78);
  RVar3 = TypeChecker::OnGlobalGet(&this->typechecker_,local_88.type);
  bVar5 = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  EVar4 = (Enum)bVar5;
  if ((RVar3.enum_ != Error && (RVar2.enum_ != Error && RVar1.enum_ != Error)) &&
     (this->in_init_expr_ == true)) {
    if (global_var->type_ != Index) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3a,"Index wabt::Var::index() const");
    }
    if (this->num_imported_globals_ <= (global_var->field_2).index_) {
      RVar1 = PrintError(this,&global_var->loc,
                         "initializer expression can only reference an imported global");
      EVar4 = (Enum)(bVar5 || RVar1.enum_ == Error);
    }
    if (local_88.mutable_ == true) {
      RVar1 = PrintError(this,loc,"initializer expression cannot reference a mutable global");
      EVar4 = (Enum)(byte)(RVar1.enum_ == Error | (byte)EVar4);
    }
  }
  return (Result)EVar4;
}

Assistant:

Result SharedValidator::OnGlobalGet(const Location& loc, Var global_var) {
  Result result = CheckInstr(Opcode::GlobalGet, loc);
  GlobalType global_type;
  result |= CheckGlobalIndex(global_var, &global_type);
  result |= typechecker_.OnGlobalGet(global_type.type);
  if (Succeeded(result) && in_init_expr_) {
    if (global_var.index() >= num_imported_globals_) {
      result |= PrintError(
          global_var.loc,
          "initializer expression can only reference an imported global");
    }
    if (global_type.mutable_) {
      result |= PrintError(
          loc, "initializer expression cannot reference a mutable global");
    }
  }

  return result;
}